

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_context.cpp
# Opt level: O3

void __thiscall
Clasp::ShortImplicationsGraph::ImplicationList::move(ImplicationList *this,ImplicationList *other)

{
  bk_lib::left_right_sequence<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>,_56U>::move
            (&this->super_ImpListBase,&other->super_ImpListBase);
  operator_delete((this->learnt)._M_b._M_p);
  LOCK();
  (this->learnt)._M_b._M_p = (other->learnt)._M_b._M_p;
  UNLOCK();
  LOCK();
  (other->learnt)._M_b._M_p = (__pointer_type)0x0;
  UNLOCK();
  return;
}

Assistant:

void ShortImplicationsGraph::ImplicationList::move(ImplicationList& other) {
	ImpListBase::move(other);
	delete static_cast<Block*>(learnt);
	learnt = static_cast<Block*>(other.learnt);
	other.learnt = 0;
}